

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O3

void __thiscall
DIS::ElectromagneticEmissionBeamData::marshal
          (ElectromagneticEmissionBeamData *this,DataStream *dataStream)

{
  pointer pTVar1;
  long lVar2;
  ulong uVar3;
  TrackJamData x;
  TrackJamData local_60;
  
  DataStream::operator<<(dataStream,this->_beamDataLength);
  DataStream::operator<<(dataStream,this->_beamIDNumber);
  DataStream::operator<<(dataStream,this->_beamParameterIndex);
  EEFundamentalParameterData::marshal(&this->_fundamentalParameterData,dataStream);
  BeamData::marshal(&this->_beamData,dataStream);
  DataStream::operator<<(dataStream,this->_beamFunction);
  DataStream::operator<<
            (dataStream,
             (char)((uint)(*(int *)&(this->_trackJamTargets).
                                    super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(this->_trackJamTargets).
                                   super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55);
  DataStream::operator<<(dataStream,this->_highDensityTrackJam);
  DataStream::operator<<(dataStream,this->_beamStatus);
  JammingTechnique::marshal(&this->_jammingTechnique,dataStream);
  pTVar1 = (this->_trackJamTargets).
           super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->_trackJamTargets).
      super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar1) {
    lVar2 = 0x28;
    uVar3 = 0;
    do {
      local_60._vptr_TrackJamData = (_func_int **)&PTR__TrackJamData_001b6470;
      local_60._entityID._vptr_EntityID = (_func_int **)&PTR__EntityID_001b45b0;
      local_60._entityID._simulationAddress._vptr_SimulationAddress =
           (_func_int **)&PTR__SimulationAddress_001b5fb8;
      local_60._entityID._simulationAddress._8_4_ = *(undefined4 *)((long)pTVar1 + lVar2 + -0x10);
      local_60._entityID._entityNumber = *(unsigned_short *)((long)pTVar1 + lVar2 + -8);
      local_60._40_2_ = *(undefined2 *)((long)&pTVar1->_vptr_TrackJamData + lVar2);
      TrackJamData::marshal(&local_60,dataStream);
      TrackJamData::~TrackJamData(&local_60);
      uVar3 = uVar3 + 1;
      pTVar1 = (this->_trackJamTargets).
               super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar2 = lVar2 + 0x30;
    } while (uVar3 < (ulong)(((long)(this->_trackJamTargets).
                                    super__Vector_base<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 4)
                            * -0x5555555555555555));
  }
  return;
}

Assistant:

void ElectromagneticEmissionBeamData::marshal(DataStream& dataStream) const
{
    dataStream << _beamDataLength;
    dataStream << _beamIDNumber;
    dataStream << _beamParameterIndex;
    _fundamentalParameterData.marshal(dataStream);
	_beamData.marshal(dataStream);
    dataStream << _beamFunction;
    dataStream << ( unsigned char )_trackJamTargets.size();
    dataStream << _highDensityTrackJam;
    dataStream << _beamStatus;
    _jammingTechnique.marshal(dataStream);

     for(size_t idx = 0; idx < _trackJamTargets.size(); idx++)
     {
        TrackJamData x = _trackJamTargets[idx];
        x.marshal(dataStream);
     }

}